

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclaredType.cpp
# Opt level: O3

void __thiscall
slang::ast::DeclaredType::mergePortTypes
          (DeclaredType *this,ASTContext *context,ValueSymbol *sourceSymbol,
          ImplicitTypeSyntax *implicit,SourceLocation location,
          span<const_slang::syntax::VariableDimensionSyntax_*const,_18446744073709551615UL>
          unpackedDimensions)

{
  SymbolKind SVar1;
  Scope *pSVar2;
  size_type sVar3;
  ValueSymbol *pVVar4;
  bool bVar5;
  bitmask<slang::ast::IntegralFlags> bVar6;
  bitwidth_t width;
  Compilation *pCVar7;
  Compilation *this_00;
  Diagnostic *pDVar8;
  _Storage<slang::ConstantRange,_true> _Var9;
  Diagnostic *pDVar10;
  pointer ppVVar11;
  EntryPointer psVar12;
  ulong uVar13;
  long lVar14;
  SourceLocation SVar15;
  pointer ppVVar16;
  string_view sVar17;
  SourceRange SVar18;
  span<const_slang::ConstantRange,_18446744073709551615UL> dimensions;
  optional<slang::ConstantRange> oVar19;
  Type *destType;
  anon_class_32_4_c3673f5c warnSignedness;
  SmallVector<slang::ConstantRange,_4UL> dims;
  SmallVector<slang::ConstantRange,_4UL> destDims;
  Compilation *local_e8;
  Compilation *local_e0;
  ValueSymbol *local_d8;
  DeclaredType *local_d0;
  ConstantRange local_c8;
  anon_class_32_4_c3673f5c local_c0;
  SmallVectorBase<slang::ConstantRange> local_a0;
  SmallVectorBase<slang::ConstantRange> local_68;
  
  SVar15 = location;
  local_d8 = sourceSymbol;
  local_d0 = this;
  pCVar7 = (Compilation *)getType(&sourceSymbol->declaredType);
  local_e8 = pCVar7;
  if ((implicit->signing).info == (Info *)0x0) {
LAB_001f8852:
    local_d0->type = (Type *)local_e8;
    if (unpackedDimensions.size_ != 0) {
      local_d0 = (DeclaredType *)(unpackedDimensions.data_ + unpackedDimensions.size_);
      lVar14 = unpackedDimensions.size_ << 3;
      while( true ) {
        pCVar7 = local_e8;
        psVar12 = (local_e8->options).topModules.
                  super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                  .entries;
        if (psVar12 == (EntryPointer)0x0) {
          Type::resolveCanonical((Type *)local_e8);
          psVar12 = (pCVar7->options).topModules.
                    super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                    .entries;
        }
        pCVar7 = local_e8;
        if (*(int *)psVar12 != 0xc) break;
        if (lVar14 == 0) {
          unpackedDimensions.data_ = (pointer)&local_d0[-1].flags;
          goto LAB_001f8909;
        }
        oVar19 = ASTContext::evalUnpackedDimension(context,*unpackedDimensions.data_);
        if ((((undefined1  [12])
              oVar19.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
              super__Optional_payload_base<slang::ConstantRange> & (undefined1  [12])0x1) ==
             (undefined1  [12])0x0) ||
           (_Var9._M_value = Type::getFixedRange((Type *)local_e8),
           _Var9 != oVar19.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                    super__Optional_payload_base<slang::ConstantRange>._M_payload))
        goto LAB_001f8909;
        local_e8 = (Compilation *)Type::getArrayElementType((Type *)local_e8);
        unpackedDimensions.data_ = (pointer)((long)unpackedDimensions.data_ + 8);
        lVar14 = lVar14 + -8;
      }
      if (lVar14 == 0) goto LAB_001f8951;
      psVar12 = (local_e8->options).topModules.
                super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                .entries;
      if (psVar12 == (EntryPointer)0x0) {
        Type::resolveCanonical((Type *)local_e8);
        psVar12 = (pCVar7->options).topModules.
                  super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                  .entries;
      }
      if (*(int *)psVar12 == 0x22) goto LAB_001f8951;
LAB_001f8909:
      SVar18 = slang::syntax::SyntaxNode::sourceRange
                         (&(*unpackedDimensions.data_)->super_SyntaxNode);
      pDVar10 = ASTContext::addDiag(context,(DiagCode)0x730006,SVar18);
      pVVar4 = local_d8;
      Diagnostic::operator<<(pDVar10,(local_d8->super_Symbol).name);
      Diagnostic::addNote(pDVar10,(DiagCode)0x40001,(pVVar4->super_Symbol).location);
    }
LAB_001f8951:
    if ((implicit->dimensions).
        super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>.size_ != 0) {
      ppVVar16 = (implicit->dimensions).
                 super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>.data_;
      while( true ) {
        pCVar7 = local_e8;
        psVar12 = (local_e8->options).topModules.
                  super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                  .entries;
        if (psVar12 == (EntryPointer)0x0) {
          Type::resolveCanonical((Type *)local_e8);
          psVar12 = (pCVar7->options).topModules.
                    super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                    .entries;
        }
        pCVar7 = local_e8;
        sVar3 = (implicit->dimensions).
                super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>.size_;
        ppVVar11 = (implicit->dimensions).
                   super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>.
                   data_ + sVar3;
        if (*(int *)psVar12 != 0xb) break;
        if (ppVVar16 == ppVVar11) {
          if (sVar3 == 0) {
            std::terminate();
          }
          ppVVar16 = ppVVar11 + -1;
          goto LAB_001f89fc;
        }
        oVar19 = ASTContext::evalPackedDimension(context,*ppVVar16);
        if ((((undefined1  [12])
              oVar19.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
              super__Optional_payload_base<slang::ConstantRange> & (undefined1  [12])0x1) ==
             (undefined1  [12])0x0) ||
           (_Var9._M_value = Type::getFixedRange((Type *)local_e8),
           _Var9 != oVar19.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                    super__Optional_payload_base<slang::ConstantRange>._M_payload))
        goto LAB_001f89fc;
        local_e8 = (Compilation *)Type::getArrayElementType((Type *)local_e8);
        ppVVar16 = ppVVar16 + 1;
      }
      if (ppVVar16 == ppVVar11) {
        return;
      }
      psVar12 = (local_e8->options).topModules.
                super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                .entries;
      if (psVar12 == (EntryPointer)0x0) {
        Type::resolveCanonical((Type *)local_e8);
        psVar12 = (pCVar7->options).topModules.
                  super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                  .entries;
      }
      if (*(int *)psVar12 == 0x22) {
        return;
      }
LAB_001f89fc:
      SVar18 = slang::syntax::SyntaxNode::sourceRange(&(*ppVVar16)->super_SyntaxNode);
      pDVar10 = ASTContext::addDiag(context,(DiagCode)0x730006,SVar18);
      pVVar4 = local_d8;
      Diagnostic::operator<<(pDVar10,(local_d8->super_Symbol).name);
      Diagnostic::addNote(pDVar10,(DiagCode)0x40001,(pVVar4->super_Symbol).location);
    }
  }
  else {
    local_e0 = (Compilation *)&implicit->signing;
    local_68.data_ = (pointer)local_68.firstElement;
    local_68.len = 0;
    local_68.cap = 4;
    while( true ) {
      psVar12 = (pCVar7->options).topModules.
                super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                .entries;
      if (psVar12 == (EntryPointer)0x0) {
        Type::resolveCanonical((Type *)pCVar7);
        psVar12 = (pCVar7->options).topModules.
                  super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                  .entries;
      }
      if (*(int *)psVar12 != 0xc) break;
      local_a0.data_ = (pointer)Type::getFixedRange((Type *)pCVar7);
      SmallVectorBase<slang::ConstantRange>::emplace_back<slang::ConstantRange>
                (&local_68,(ConstantRange *)&local_a0);
      pCVar7 = (Compilation *)Type::getArrayElementType((Type *)pCVar7);
    }
    if (*(int *)psVar12 != 0x22) {
      bVar5 = Type::isIntegral((Type *)pCVar7);
      if (bVar5) {
        local_c0.sourceSymbol = local_d8;
        local_c0.context = context;
        local_c0.implicit = implicit;
        if ((implicit->signing).kind == SignedKeyword) {
          local_c0.destType = (Type **)&local_e8;
          bVar5 = Type::isSigned((Type *)pCVar7);
          if (!bVar5) {
            pSVar2 = (context->scope).ptr;
            if (pSVar2 == (Scope *)0x0) {
LAB_001f8a77:
              assert::assertFailed
                        ("ptr",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                         ,0x26,
                         "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]"
                        );
            }
            local_e0 = pSVar2->compilation;
            local_a0.data_ = (pointer)local_a0.firstElement;
            local_a0.len = 0;
            local_a0.cap = 4;
            for (this_00 = pCVar7; SVar1 = ((Symbol *)&this_00->super_BumpAllocator)->kind,
                SVar1 == PackedArrayType;
                this_00 = (Compilation *)Type::getArrayElementType((Type *)this_00)) {
              local_c8 = Type::getFixedRange((Type *)this_00);
              SmallVectorBase<slang::ConstantRange>::emplace_back<slang::ConstantRange>
                        (&local_a0,&local_c8);
            }
            if (SVar1 == ScalarType) {
              bVar6 = Type::getIntegralFlags((Type *)this_00);
              if (local_a0.len == 1) {
                width = Type::getBitWidth((Type *)pCVar7);
                pCVar7 = (Compilation *)
                         Compilation::getType
                                   (local_e0,width,
                                    (bitmask<slang::ast::IntegralFlags>)(bVar6.m_bits | 1));
              }
              else {
                pCVar7 = (Compilation *)
                         Compilation::getScalarType
                                   (local_e0,(bitmask<slang::ast::IntegralFlags>)(bVar6.m_bits | 1))
                ;
                if (local_a0.len != 0) {
                  lVar14 = local_a0.len * 8;
                  uVar13 = local_a0.len;
                  do {
                    lVar14 = lVar14 + -8;
                    uVar13 = uVar13 - 1;
                    if (local_a0.len <= uVar13) {
                      assert::assertFailed
                                ("index < len",
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/SmallVector.h"
                                 ,0x196,
                                 "reference slang::SmallVectorBase<slang::ConstantRange>::operator[](size_type) [T = slang::ConstantRange]"
                                );
                    }
                    pCVar7 = (Compilation *)
                             BumpAllocator::
                             emplace<slang::ast::PackedArrayType,slang::ast::Type_const&,slang::ConstantRange&>
                                       (&local_e0->super_BumpAllocator,(Type *)pCVar7,
                                        (ConstantRange *)((long)local_a0.data_ + lVar14));
                  } while (uVar13 != 0);
                }
              }
            }
            if (local_a0.data_ != (pointer)local_a0.firstElement) {
              free(local_a0.data_);
            }
            bVar5 = Type::isSigned((Type *)pCVar7);
            if (bVar5) {
              pSVar2 = (context->scope).ptr;
              if (pSVar2 == (Scope *)0x0) goto LAB_001f8a77;
              dimensions.size_ = (size_type)SVar15;
              dimensions.data_ = (pointer)local_68.len;
              local_e8 = (Compilation *)
                         FixedSizeUnpackedArrayType::fromDims
                                   ((FixedSizeUnpackedArrayType *)pSVar2->compilation,pCVar7,
                                    (Type *)local_68.data_,dimensions);
            }
            else {
              mergePortTypes::anon_class_32_4_c3673f5c::operator()(&local_c0);
            }
          }
        }
        else {
          local_c0.destType = (Type **)&local_e8;
          bVar5 = Type::isSigned((Type *)pCVar7);
          if (bVar5) {
            SVar18 = parsing::Token::range((Token *)local_e0);
            pDVar10 = ASTContext::addDiag(context,(DiagCode)0xb20006,SVar18);
            sVar17 = parsing::Token::valueText((Token *)local_e0);
            pDVar8 = Diagnostic::operator<<(pDVar10,sVar17);
            ast::operator<<(pDVar8,*local_c0.destType);
            Diagnostic::addNote(pDVar10,(DiagCode)0x40001,
                                ((local_c0.sourceSymbol)->super_Symbol).location);
          }
        }
        if (local_68.data_ != (pointer)local_68.firstElement) {
          free(local_68.data_);
        }
        goto LAB_001f8852;
      }
      if (((local_d8->super_Symbol).kind == Net) &&
         (*(int *)(*(long *)&local_d8[1].super_Symbol + 0x80) == 0xd)) {
        SVar18 = parsing::Token::range((Token *)local_e0);
        pDVar10 = ASTContext::addDiag(context,(DiagCode)0x510005,SVar18);
        Diagnostic::addNote(pDVar10,(DiagCode)0x40001,(local_d8->super_Symbol).location);
      }
      else {
        pDVar10 = ASTContext::addDiag(context,(DiagCode)0xc0006,location);
        pDVar8 = Diagnostic::operator<<(pDVar10,(local_d8->super_Symbol).name);
        sVar17 = parsing::Token::valueText((Token *)local_e0);
        pDVar8 = Diagnostic::operator<<(pDVar8,sVar17);
        ast::operator<<(pDVar8,(Type *)local_e8);
        Diagnostic::addNote(pDVar10,(DiagCode)0x40001,(local_d8->super_Symbol).location);
      }
    }
    if (local_68.data_ != (pointer)local_68.firstElement) {
      free(local_68.data_);
    }
  }
  return;
}

Assistant:

void DeclaredType::mergePortTypes(
    const ASTContext& context, const ValueSymbol& sourceSymbol, const ImplicitTypeSyntax& implicit,
    SourceLocation location, span<const VariableDimensionSyntax* const> unpackedDimensions) const {

    // There's this really terrible "feature" where the port declaration can influence the type
    // of the actual symbol somewhere else in the tree. This is ugly but should be safe since
    // nobody else can look at that symbol's type until we've gone through elaboration.
    //
    // In this context, the sourceSymbol is the actual variable declaration with, presumably,
    // a full type declared. The implicit syntax is from the port I/O declaration, which needs
    // to be merged. For example:
    //
    //   input signed [1:0] foo;    // implicit + unpackedDimensions + location
    //   logic foo;                 // sourceSymbol
    const Type* destType = &sourceSymbol.getType();

    if (implicit.signing) {
        // Drill past any unpacked arrays to figure out if this thing is even integral.
        SmallVector<ConstantRange, 4> destDims;
        const Type* sourceType = destType;
        while (sourceType->getCanonicalType().kind == SymbolKind::FixedSizeUnpackedArrayType) {
            destDims.push_back(sourceType->getFixedRange());
            sourceType = sourceType->getArrayElementType();
        }

        if (sourceType->isError())
            return;

        if (!sourceType->isIntegral()) {
            if (sourceSymbol.kind == SymbolKind::Net &&
                sourceSymbol.as<NetSymbol>().netType.netKind == NetType::Interconnect) {
                auto& diag = context.addDiag(diag::InterconnectTypeSyntax,
                                             implicit.signing.range());
                diag.addNote(diag::NoteDeclarationHere, sourceSymbol.location);
            }
            else {
                auto& diag = context.addDiag(diag::CantDeclarePortSigned, location);
                diag << sourceSymbol.name << implicit.signing.valueText() << *destType;
                diag.addNote(diag::NoteDeclarationHere, sourceSymbol.location);
            }
            return;
        }

        auto warnSignedness = [&] {
            auto& diag = context.addDiag(diag::SignednessNoEffect, implicit.signing.range());
            diag << implicit.signing.valueText() << *destType;
            diag.addNote(diag::NoteDeclarationHere, sourceSymbol.location);
        };

        bool shouldBeSigned = implicit.signing.kind == TokenKind::SignedKeyword;
        if (shouldBeSigned && !sourceType->isSigned()) {
            sourceType = makeSigned(context.getCompilation(), *sourceType);
            if (!sourceType->isSigned()) {
                warnSignedness();
            }
            else {
                // Put the unpacked dimensions back on the type now that it
                // has been made signed.
                destType = &FixedSizeUnpackedArrayType::fromDims(context.getCompilation(),
                                                                 *sourceType, destDims);
            }
        }
        else if (!shouldBeSigned && sourceType->isSigned()) {
            warnSignedness();
        }
    }

    // Our declared type takes on the merged type from the variable definition.
    this->type = destType;

    auto errorDims = [&](auto& dims) {
        auto& diag = context.addDiag(diag::PortDeclDimensionsMismatch, dims.sourceRange());
        diag << sourceSymbol.name;
        diag.addNote(diag::NoteDeclarationHere, sourceSymbol.location);
    };

    auto checkDims = [&](auto& dims, SymbolKind arrayKind, bool isPacked) {
        if (!dims.empty()) {
            auto it = dims.begin();
            while (destType->getCanonicalType().kind == arrayKind) {
                if (it == dims.end()) {
                    errorDims(*dims.back());
                    return;
                }

                auto dim = isPacked ? context.evalPackedDimension(**it)
                                    : context.evalUnpackedDimension(**it);
                if (!dim || destType->getFixedRange() != *dim) {
                    errorDims(**it);
                    return;
                }

                destType = destType->getArrayElementType();
                it++;
            }

            if (it != dims.end() && !destType->isError()) {
                errorDims(**it);
                return;
            }
        }
    };

    // Unpacked dim checks have to come first because it unwraps the destType
    // for the packed one to look at.
    checkDims(unpackedDimensions, SymbolKind::FixedSizeUnpackedArrayType, false);
    checkDims(implicit.dimensions, SymbolKind::PackedArrayType, true);
}